

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tznames_impl.cpp
# Opt level: O2

void __thiscall
icu_63::TextTrieMap::search
          (TextTrieMap *this,UnicodeString *text,int32_t start,
          TextTrieMapSearchResultHandler *handler,UErrorCode *status)

{
  TextTrieMap *nonConstThis;
  Mutex lock;
  Mutex local_30;
  
  local_30.fMutex = (UMutex *)TextTrieMutex;
  umtx_lock_63((UMutex *)TextTrieMutex);
  if (this->fLazyContents != (UVector *)0x0) {
    buildTrie(this,status);
  }
  Mutex::~Mutex(&local_30);
  if (this->fNodes != (CharacterNode *)0x0) {
    search(this,this->fNodes,text,start,start,handler,status);
  }
  return;
}

Assistant:

void
TextTrieMap::search(const UnicodeString &text, int32_t start,
                  TextTrieMapSearchResultHandler *handler, UErrorCode &status) const {
    {
        // TODO: if locking the mutex for each check proves to be a performance problem,
        //       add a flag of type atomic_int32_t to class TextTrieMap, and use only
        //       the ICU atomic safe functions for assigning and testing.
        //       Don't test the pointer fLazyContents.
        //       Don't do unless it's really required.
        Mutex lock(&TextTrieMutex);
        if (fLazyContents != NULL) {
            TextTrieMap *nonConstThis = const_cast<TextTrieMap *>(this);
            nonConstThis->buildTrie(status);
        }
    }
    if (fNodes == NULL) {
        return;
    }
    search(fNodes, text, start, start, handler, status);
}